

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall wabt::WastLexer::GetKeywordToken(Token *__return_storage_ptr__,WastLexer *this)

{
  TokenType token_type;
  Location loc;
  Location loc_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  TokenInfo *pTVar5;
  byte *pbVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  anon_class_8_1_8991fb9c column;
  undefined4 uStack_34;
  undefined4 uStack_14;
  
  pbVar6 = (byte *)this->cursor_;
  do {
    if (pbVar6 < this->buffer_end_) {
      lVar8 = (ulong)*pbVar6 + 1;
    }
    else {
      lVar8 = 0;
    }
    do {
      if ((""[lVar8] & 1U) == 0) {
        pTVar5 = anon_unknown_9::Perfect_Hash::InWordSet
                           (this->token_start_,(long)this->cursor_ - (long)this->token_start_);
        if (pTVar5 == (TokenInfo *)0x0) {
          TextToken(__return_storage_ptr__,this,Reserved,0);
        }
        else {
          token_type = pTVar5->token_type;
          if (token_type < First_Literal) {
            BareToken(__return_storage_ptr__,this,token_type);
          }
          else if (token_type - First_Type < 4) {
            uVar1 = (this->filename_)._M_dataplus;
            uVar2 = (this->filename_)._M_string_length;
            loc.filename.size_ = uVar2;
            loc.filename.data_ = (char *)uVar1;
            iVar7 = (*(int *)&this->token_start_ - *(int *)&this->line_start_) + 1;
            if (iVar7 < 2) {
              iVar7 = 1;
            }
            iVar9 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
            if (iVar9 < 2) {
              iVar9 = 1;
            }
            loc.field_1.field_0.first_column = iVar7;
            loc.field_1.field_0.line = this->line_;
            loc.field_1._12_4_ = uStack_14;
            loc.field_1.field_0.last_column = iVar9;
            Token::Token(__return_storage_ptr__,loc,pTVar5->token_type,
                         (Type)(pTVar5->field_2).value_type.enum_);
          }
          else {
            if (0x3e < token_type - AtomicFence) {
              __assert_fail("IsTokenTypeOpcode(info->token_type)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-lexer.cc"
                            ,0x223,"Token wabt::WastLexer::GetKeywordToken()");
            }
            uVar3 = (this->filename_)._M_dataplus;
            uVar4 = (this->filename_)._M_string_length;
            loc_00.filename.size_ = uVar4;
            loc_00.filename.data_ = (char *)uVar3;
            iVar7 = (*(int *)&this->token_start_ - *(int *)&this->line_start_) + 1;
            if (iVar7 < 2) {
              iVar7 = 1;
            }
            iVar9 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
            if (iVar9 < 2) {
              iVar9 = 1;
            }
            loc_00.field_1.field_0.first_column = iVar7;
            loc_00.field_1.field_0.line = this->line_;
            loc_00.field_1._12_4_ = uStack_34;
            loc_00.field_1.field_0.last_column = iVar9;
            Token::Token(__return_storage_ptr__,loc_00,pTVar5->token_type,
                         (Opcode)(pTVar5->field_2).opcode.enum_);
          }
        }
        return __return_storage_ptr__;
      }
      lVar8 = 0;
    } while (this->buffer_end_ <= pbVar6);
    pbVar6 = pbVar6 + 1;
    this->cursor_ = (char *)pbVar6;
  } while( true );
}

Assistant:

Token WastLexer::GetKeywordToken() {
  ReadReservedChars();
  TokenInfo* info =
      Perfect_Hash::InWordSet(token_start_, cursor_ - token_start_);
  if (!info) {
    return TextToken(TokenType::Reserved);
  }
  if (IsTokenTypeBare(info->token_type)) {
    return BareToken(info->token_type);
  } else if (IsTokenTypeType(info->token_type) ||
             IsTokenTypeRefKind(info->token_type)) {
    return Token(GetLocation(), info->token_type, info->value_type);
  } else {
    assert(IsTokenTypeOpcode(info->token_type));
    return Token(GetLocation(), info->token_type, info->opcode);
  }
}